

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O2

int ON_WindowsBitmapHelper_PaletteColorCount(int bmiHeader_biClrUsed,int bmiHeader_biBitCount)

{
  int iVar1;
  
  if (bmiHeader_biClrUsed != 0) {
    return bmiHeader_biClrUsed;
  }
  if (bmiHeader_biBitCount == 1) {
    iVar1 = 2;
  }
  else {
    if (bmiHeader_biBitCount == 8) {
      return 0x100;
    }
    if (bmiHeader_biBitCount != 4) {
      return 0;
    }
    iVar1 = 0x10;
  }
  return iVar1;
}

Assistant:

static
int ON_WindowsBitmapHelper_PaletteColorCount( int bmiHeader_biClrUsed, int bmiHeader_biBitCount )
{
  int color_count = 0;
  
  if ( bmiHeader_biClrUsed )
  {
    color_count = bmiHeader_biClrUsed;
  }
  else 
  {  
    switch( bmiHeader_biBitCount )
    {
    case 1:
      color_count = 2;
      break;
    case 4:
      color_count = 16;
      break;
    case 8:
      color_count = 256;
      break;
    default:
      color_count = 0;
    }
  }  
  return color_count;
}